

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  ImTextureID pvVar3;
  ImDrawCmd *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  ImDrawCmd *__dest;
  int iVar10;
  int iVar11;
  
  fVar5 = (this->_CmdHeader).ClipRect.x;
  fVar6 = (this->_CmdHeader).ClipRect.y;
  fVar7 = (this->_CmdHeader).ClipRect.z;
  fVar8 = (this->_CmdHeader).ClipRect.w;
  pvVar3 = (this->_CmdHeader).TextureId;
  uVar1 = (this->_CmdHeader).VtxOffset;
  iVar9 = (this->CmdBuffer).Size;
  uVar2 = (this->IdxBuffer).Size;
  if (iVar9 == (this->CmdBuffer).Capacity) {
    if (iVar9 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar9 / 2 + iVar9;
    }
    iVar11 = iVar9 + 1;
    if (iVar9 + 1 < iVar10) {
      iVar11 = iVar10;
    }
    __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
    pIVar4 = (this->CmdBuffer).Data;
    if (pIVar4 != (ImDrawCmd *)0x0) {
      memcpy(__dest,pIVar4,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = __dest;
    (this->CmdBuffer).Capacity = iVar11;
    iVar9 = (this->CmdBuffer).Size;
  }
  else {
    __dest = (this->CmdBuffer).Data;
  }
  pIVar4 = __dest + iVar9;
  (pIVar4->ClipRect).x = fVar5;
  (pIVar4->ClipRect).y = fVar6;
  (pIVar4->ClipRect).z = fVar7;
  (pIVar4->ClipRect).w = fVar8;
  __dest[iVar9].TextureId = pvVar3;
  __dest[iVar9].VtxOffset = uVar1;
  __dest[iVar9].IdxOffset = uVar2;
  *(undefined8 *)&__dest[iVar9].ElemCount = 0;
  *(ImDrawCallback *)(&__dest[iVar9].ElemCount + 2) = (ImDrawCallback)0x0;
  __dest[iVar9].UserCallbackData = (void *)0x0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}